

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_bitonic_sort_14(int64_t *dst)

{
  long lVar1;
  long *in_RDI;
  int64_t _sort_swap_temp_34;
  int64_t _sort_swap_temp_33;
  int64_t _sort_swap_temp_32;
  int64_t _sort_swap_temp_31;
  int64_t _sort_swap_temp_30;
  int64_t _sort_swap_temp_29;
  int64_t _sort_swap_temp_28;
  int64_t _sort_swap_temp_27;
  int64_t _sort_swap_temp_26;
  int64_t _sort_swap_temp_25;
  int64_t _sort_swap_temp_24;
  int64_t _sort_swap_temp_23;
  int64_t _sort_swap_temp_22;
  int64_t _sort_swap_temp_21;
  int64_t _sort_swap_temp_20;
  int64_t _sort_swap_temp_19;
  int64_t _sort_swap_temp_18;
  int64_t _sort_swap_temp_17;
  int64_t _sort_swap_temp_16;
  int64_t _sort_swap_temp_15;
  int64_t _sort_swap_temp_14;
  int64_t _sort_swap_temp_13;
  int64_t _sort_swap_temp_12;
  int64_t _sort_swap_temp_11;
  int64_t _sort_swap_temp_10;
  int64_t _sort_swap_temp_9;
  int64_t _sort_swap_temp_8;
  int64_t _sort_swap_temp_7;
  int64_t _sort_swap_temp_6;
  int64_t _sort_swap_temp_5;
  int64_t _sort_swap_temp_4;
  int64_t _sort_swap_temp_3;
  int64_t _sort_swap_temp_2;
  int64_t _sort_swap_temp_1;
  int64_t _sort_swap_temp;
  int64_t _sort_swap_temp_50;
  int64_t _sort_swap_temp_49;
  int64_t _sort_swap_temp_48;
  int64_t _sort_swap_temp_47;
  int64_t _sort_swap_temp_46;
  int64_t _sort_swap_temp_45;
  int64_t _sort_swap_temp_44;
  int64_t _sort_swap_temp_43;
  int64_t _sort_swap_temp_42;
  int64_t _sort_swap_temp_41;
  int64_t _sort_swap_temp_40;
  int64_t _sort_swap_temp_39;
  int64_t _sort_swap_temp_38;
  int64_t _sort_swap_temp_37;
  int64_t _sort_swap_temp_36;
  int64_t _sort_swap_temp_35;
  
  if (0 < *in_RDI - in_RDI[1]) {
    lVar1 = *in_RDI;
    *in_RDI = in_RDI[1];
    in_RDI[1] = lVar1;
  }
  if (0 < in_RDI[2] - in_RDI[3]) {
    lVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[3];
    in_RDI[3] = lVar1;
  }
  if (0 < in_RDI[4] - in_RDI[5]) {
    lVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[5];
    in_RDI[5] = lVar1;
  }
  if (0 < in_RDI[6] - in_RDI[7]) {
    lVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[7];
    in_RDI[7] = lVar1;
  }
  if (0 < in_RDI[8] - in_RDI[9]) {
    lVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[9];
    in_RDI[9] = lVar1;
  }
  if (0 < in_RDI[10] - in_RDI[0xb]) {
    lVar1 = in_RDI[10];
    in_RDI[10] = in_RDI[0xb];
    in_RDI[0xb] = lVar1;
  }
  if (0 < in_RDI[0xc] - in_RDI[0xd]) {
    lVar1 = in_RDI[0xc];
    in_RDI[0xc] = in_RDI[0xd];
    in_RDI[0xd] = lVar1;
  }
  if (0 < *in_RDI - in_RDI[2]) {
    lVar1 = *in_RDI;
    *in_RDI = in_RDI[2];
    in_RDI[2] = lVar1;
  }
  if (0 < in_RDI[4] - in_RDI[6]) {
    lVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[6];
    in_RDI[6] = lVar1;
  }
  if (0 < in_RDI[8] - in_RDI[10]) {
    lVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[10];
    in_RDI[10] = lVar1;
  }
  if (0 < in_RDI[1] - in_RDI[3]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[3];
    in_RDI[3] = lVar1;
  }
  if (0 < in_RDI[5] - in_RDI[7]) {
    lVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[7];
    in_RDI[7] = lVar1;
  }
  if (0 < in_RDI[9] - in_RDI[0xb]) {
    lVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[0xb];
    in_RDI[0xb] = lVar1;
  }
  if (0 < *in_RDI - in_RDI[4]) {
    lVar1 = *in_RDI;
    *in_RDI = in_RDI[4];
    in_RDI[4] = lVar1;
  }
  if (0 < in_RDI[8] - in_RDI[0xc]) {
    lVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[1] - in_RDI[5]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[5];
    in_RDI[5] = lVar1;
  }
  if (0 < in_RDI[9] - in_RDI[0xd]) {
    lVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[0xd];
    in_RDI[0xd] = lVar1;
  }
  if (0 < in_RDI[2] - in_RDI[6]) {
    lVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[6];
    in_RDI[6] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[7]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[7];
    in_RDI[7] = lVar1;
  }
  if (0 < *in_RDI - in_RDI[8]) {
    lVar1 = *in_RDI;
    *in_RDI = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[1] - in_RDI[9]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[9];
    in_RDI[9] = lVar1;
  }
  if (0 < in_RDI[2] - in_RDI[10]) {
    lVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[10];
    in_RDI[10] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[0xb]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[0xb];
    in_RDI[0xb] = lVar1;
  }
  if (0 < in_RDI[4] - in_RDI[0xc]) {
    lVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[5] - in_RDI[0xd]) {
    lVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[0xd];
    in_RDI[0xd] = lVar1;
  }
  if (0 < in_RDI[5] - in_RDI[10]) {
    lVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[10];
    in_RDI[10] = lVar1;
  }
  if (0 < in_RDI[6] - in_RDI[9]) {
    lVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[9];
    in_RDI[9] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[0xc]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[7] - in_RDI[0xb]) {
    lVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[0xb];
    in_RDI[0xb] = lVar1;
  }
  if (0 < in_RDI[1] - in_RDI[2]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[2];
    in_RDI[2] = lVar1;
  }
  if (0 < in_RDI[4] - in_RDI[8]) {
    lVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[1] - in_RDI[4]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[4];
    in_RDI[4] = lVar1;
  }
  if (0 < in_RDI[7] - in_RDI[0xd]) {
    lVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[0xd];
    in_RDI[0xd] = lVar1;
  }
  if (0 < in_RDI[2] - in_RDI[8]) {
    lVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[5] - in_RDI[6]) {
    lVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[6];
    in_RDI[6] = lVar1;
  }
  if (0 < in_RDI[9] - in_RDI[10]) {
    lVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[10];
    in_RDI[10] = lVar1;
  }
  if (0 < in_RDI[2] - in_RDI[4]) {
    lVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[4];
    in_RDI[4] = lVar1;
  }
  if (0 < in_RDI[0xb] - in_RDI[0xd]) {
    lVar1 = in_RDI[0xb];
    in_RDI[0xb] = in_RDI[0xd];
    in_RDI[0xd] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[8]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[7] - in_RDI[0xc]) {
    lVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[6] - in_RDI[8]) {
    lVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[10] - in_RDI[0xc]) {
    lVar1 = in_RDI[10];
    in_RDI[10] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[5]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[5];
    in_RDI[5] = lVar1;
  }
  if (0 < in_RDI[7] - in_RDI[9]) {
    lVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[9];
    in_RDI[9] = lVar1;
  }
  if (0 < in_RDI[3] - in_RDI[4]) {
    lVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[4];
    in_RDI[4] = lVar1;
  }
  if (0 < in_RDI[5] - in_RDI[6]) {
    lVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[6];
    in_RDI[6] = lVar1;
  }
  if (0 < in_RDI[7] - in_RDI[8]) {
    lVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[8];
    in_RDI[8] = lVar1;
  }
  if (0 < in_RDI[9] - in_RDI[10]) {
    lVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[10];
    in_RDI[10] = lVar1;
  }
  if (0 < in_RDI[0xb] - in_RDI[0xc]) {
    lVar1 = in_RDI[0xb];
    in_RDI[0xb] = in_RDI[0xc];
    in_RDI[0xc] = lVar1;
  }
  if (0 < in_RDI[6] - in_RDI[7]) {
    lVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[7];
    in_RDI[7] = lVar1;
  }
  if (0 < in_RDI[8] - in_RDI[9]) {
    lVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[9];
    in_RDI[9] = lVar1;
  }
  return;
}

Assistant:

static __inline void BITONIC_SORT_14(SORT_TYPE *dst) {
  SORT_CSWAP(dst[0], dst[1]);
  SORT_CSWAP(dst[2], dst[3]);
  SORT_CSWAP(dst[4], dst[5]);
  SORT_CSWAP(dst[6], dst[7]);
  SORT_CSWAP(dst[8], dst[9]);
  SORT_CSWAP(dst[10], dst[11]);
  SORT_CSWAP(dst[12], dst[13]);
  SORT_CSWAP(dst[0], dst[2]);
  SORT_CSWAP(dst[4], dst[6]);
  SORT_CSWAP(dst[8], dst[10]);
  SORT_CSWAP(dst[1], dst[3]);
  SORT_CSWAP(dst[5], dst[7]);
  SORT_CSWAP(dst[9], dst[11]);
  SORT_CSWAP(dst[0], dst[4]);
  SORT_CSWAP(dst[8], dst[12]);
  SORT_CSWAP(dst[1], dst[5]);
  SORT_CSWAP(dst[9], dst[13]);
  SORT_CSWAP(dst[2], dst[6]);
  SORT_CSWAP(dst[3], dst[7]);
  SORT_CSWAP(dst[0], dst[8]);
  SORT_CSWAP(dst[1], dst[9]);
  SORT_CSWAP(dst[2], dst[10]);
  SORT_CSWAP(dst[3], dst[11]);
  SORT_CSWAP(dst[4], dst[12]);
  SORT_CSWAP(dst[5], dst[13]);
  SORT_CSWAP(dst[5], dst[10]);
  SORT_CSWAP(dst[6], dst[9]);
  SORT_CSWAP(dst[3], dst[12]);
  SORT_CSWAP(dst[7], dst[11]);
  SORT_CSWAP(dst[1], dst[2]);
  SORT_CSWAP(dst[4], dst[8]);
  SORT_CSWAP(dst[1], dst[4]);
  SORT_CSWAP(dst[7], dst[13]);
  SORT_CSWAP(dst[2], dst[8]);
  SORT_CSWAP(dst[5], dst[6]);
  SORT_CSWAP(dst[9], dst[10]);
  SORT_CSWAP(dst[2], dst[4]);
  SORT_CSWAP(dst[11], dst[13]);
  SORT_CSWAP(dst[3], dst[8]);
  SORT_CSWAP(dst[7], dst[12]);
  SORT_CSWAP(dst[6], dst[8]);
  SORT_CSWAP(dst[10], dst[12]);
  SORT_CSWAP(dst[3], dst[5]);
  SORT_CSWAP(dst[7], dst[9]);
  SORT_CSWAP(dst[3], dst[4]);
  SORT_CSWAP(dst[5], dst[6]);
  SORT_CSWAP(dst[7], dst[8]);
  SORT_CSWAP(dst[9], dst[10]);
  SORT_CSWAP(dst[11], dst[12]);
  SORT_CSWAP(dst[6], dst[7]);
  SORT_CSWAP(dst[8], dst[9]);
}